

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utrie2.cpp
# Opt level: O2

void utrie2_close_63(UTrie2 *trie)

{
  if (trie != (UTrie2 *)0x0) {
    if (trie->isMemoryOwned != '\0') {
      uprv_free_63(trie->memory);
    }
    if (trie->newTrie != (UNewTrie2 *)0x0) {
      uprv_free_63(trie->newTrie->data);
      uprv_free_63(trie->newTrie);
    }
    uprv_free_63(trie);
    return;
  }
  return;
}

Assistant:

U_CAPI void U_EXPORT2
utrie2_close(UTrie2 *trie) {
    if(trie!=NULL) {
        if(trie->isMemoryOwned) {
            uprv_free(trie->memory);
        }
        if(trie->newTrie!=NULL) {
            uprv_free(trie->newTrie->data);
#ifdef UCPTRIE_DEBUG
            umutablecptrie_close(trie->newTrie->t3);
#endif
            uprv_free(trie->newTrie);
        }
        uprv_free(trie);
    }
}